

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvertUTF.cpp
# Opt level: O3

ConversionResult
llvm::ConvertUTF8toUTF16
          (UTF8 **sourceStart,UTF8 *sourceEnd,UTF16 **targetStart,UTF16 *targetEnd,
          ConversionFlags flags)

{
  byte bVar1;
  Boolean BVar2;
  ConversionResult CVar3;
  uint length;
  uint uVar4;
  ushort *puVar5;
  byte *source;
  
  source = *sourceStart;
  puVar5 = *targetStart;
  do {
    if (sourceEnd <= source) {
      CVar3 = conversionOK;
LAB_001abc7e:
      *sourceStart = source;
      *targetStart = puVar5;
      return CVar3;
    }
    bVar1 = trailingBytesForUTF8[*source];
    uVar4 = (int)(char)bVar1 & 0xffff;
    if ((long)sourceEnd - (long)source <= (long)(ulong)uVar4) {
      CVar3 = sourceExhausted;
      goto LAB_001abc7e;
    }
    length = uVar4 + 1;
    BVar2 = isLegalUTF8(source,length);
    CVar3 = sourceIllegal;
    if (BVar2 == '\0') goto LAB_001abc7e;
    if ((byte)uVar4 < 6) {
      CVar3 = (*(code *)(&DAT_001d9d70 + *(int *)(&DAT_001d9d70 + (ulong)bVar1 * 4)))();
      return CVar3;
    }
    if (targetEnd <= puVar5) {
LAB_001abc9d:
      source = source + -(ulong)length;
      CVar3 = targetExhausted;
      goto LAB_001abc7e;
    }
    uVar4 = -*(int *)(offsetsFromUTF8 + (ulong)uVar4 * 4);
    if (uVar4 < 0x10000) {
      if ((uVar4 & 0xf800) == 0xd800) {
LAB_001abc2e:
        if (flags == strictConversion) {
          source = source + -(ulong)length;
          goto LAB_001abc7e;
        }
        *puVar5 = 0xfffd;
      }
      else {
        *puVar5 = (ushort)uVar4;
      }
      puVar5 = puVar5 + 1;
    }
    else {
      if (0x10ffff < uVar4) goto LAB_001abc2e;
      if (targetEnd <= puVar5 + 1) goto LAB_001abc9d;
      *puVar5 = (short)(uVar4 + 0x3ff0000 >> 10) + 0xd800;
      puVar5[1] = (ushort)uVar4 & 0x3ff | 0xdc00;
      puVar5 = puVar5 + 2;
    }
  } while( true );
}

Assistant:

ConversionResult ConvertUTF8toUTF16 (
        const UTF8** sourceStart, const UTF8* sourceEnd,
        UTF16** targetStart, UTF16* targetEnd, ConversionFlags flags) {
    ConversionResult result = conversionOK;
    const UTF8* source = *sourceStart;
    UTF16* target = *targetStart;
    while (source < sourceEnd) {
        UTF32 ch = 0;
        unsigned short extraBytesToRead = trailingBytesForUTF8[*source];
        if (extraBytesToRead >= sourceEnd - source) {
            result = sourceExhausted; break;
        }
        /* Do this check whether lenient or strict */
        if (!isLegalUTF8(source, extraBytesToRead+1)) {
            result = sourceIllegal;
            break;
        }
        /*
         * The cases all fall through. See "Note A" below.
         */
        switch (extraBytesToRead) {
            case 5: ch += *source++; ch <<= 6; /* remember, illegal UTF-8 */
            case 4: ch += *source++; ch <<= 6; /* remember, illegal UTF-8 */
            case 3: ch += *source++; ch <<= 6;
            case 2: ch += *source++; ch <<= 6;
            case 1: ch += *source++; ch <<= 6;
            case 0: ch += *source++;
        }
        ch -= offsetsFromUTF8[extraBytesToRead];

        if (target >= targetEnd) {
            source -= (extraBytesToRead+1); /* Back up source pointer! */
            result = targetExhausted; break;
        }
        if (ch <= UNI_MAX_BMP) { /* Target is a character <= 0xFFFF */
            /* UTF-16 surrogate values are illegal in UTF-32 */
            if (ch >= UNI_SUR_HIGH_START && ch <= UNI_SUR_LOW_END) {
                if (flags == strictConversion) {
                    source -= (extraBytesToRead+1); /* return to the illegal value itself */
                    result = sourceIllegal;
                    break;
                } else {
                    *target++ = UNI_REPLACEMENT_CHAR;
                }
            } else {
                *target++ = (UTF16)ch; /* normal case */
            }
        } else if (ch > UNI_MAX_UTF16) {
            if (flags == strictConversion) {
                result = sourceIllegal;
                source -= (extraBytesToRead+1); /* return to the start */
                break; /* Bail out; shouldn't continue */
            } else {
                *target++ = UNI_REPLACEMENT_CHAR;
            }
        } else {
            /* target is a character in range 0xFFFF - 0x10FFFF. */
            if (target + 1 >= targetEnd) {
                source -= (extraBytesToRead+1); /* Back up source pointer! */
                result = targetExhausted; break;
            }
            ch -= halfBase;
            *target++ = (UTF16)((ch >> halfShift) + UNI_SUR_HIGH_START);
            *target++ = (UTF16)((ch & halfMask) + UNI_SUR_LOW_START);
        }
    }
    *sourceStart = source;
    *targetStart = target;
    return result;
}